

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

int OpenPcm(snd_pcm_t **pcmp,char *name,snd_pcm_stream_t stream,int mode,int waitOnBusy)

{
  int local_34;
  int local_2c;
  int maxTries;
  int tries;
  int ret;
  int waitOnBusy_local;
  int mode_local;
  snd_pcm_stream_t stream_local;
  char *name_local;
  snd_pcm_t **pcmp_local;
  
  if (waitOnBusy == 0) {
    local_34 = 0;
  }
  else {
    local_34 = busyRetries_;
  }
  maxTries = (*alsa_snd_pcm_open)(pcmp,name,stream,mode);
  for (local_2c = 0; local_2c < local_34 && maxTries == -0x10; local_2c = local_2c + 1) {
    Pa_Sleep(10);
    maxTries = (*alsa_snd_pcm_open)(pcmp,name,stream,mode);
  }
  return maxTries;
}

Assistant:

static int OpenPcm( snd_pcm_t **pcmp, const char *name, snd_pcm_stream_t stream, int mode, int waitOnBusy )
{
    int ret, tries = 0, maxTries = waitOnBusy ? busyRetries_ : 0;

    ret = alsa_snd_pcm_open( pcmp, name, stream, mode );

    for( tries = 0; tries < maxTries && -EBUSY == ret; ++tries )
    {
        Pa_Sleep( 10 );
        ret = alsa_snd_pcm_open( pcmp, name, stream, mode );
        if( -EBUSY != ret )
        {
            PA_DEBUG(( "%s: Successfully opened initially busy device after %d tries\n", __FUNCTION__, tries ));
        }
    }
    if( -EBUSY == ret )
    {
        PA_DEBUG(( "%s: Failed to open busy device '%s'\n", __FUNCTION__, name ));
    }
    else
    {
        if( ret < 0 )
            PA_DEBUG(( "%s: Opened device '%s' ptr[%p] - result: [%d:%s]\n", __FUNCTION__, name, *pcmp, ret, alsa_snd_strerror(ret) ));
    }

    return ret;
}